

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::warning(CScanner *this,TWarning warning,char c)

{
  int line;
  int position;
  ostream *poVar1;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream warningStream;
  char c_local;
  TWarning warning_local;
  CScanner *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (warning == W_Semicolon) {
    poVar1 = std::operator<<((ostream *)local_190,"using `");
    poVar1 = std::operator<<(poVar1,c);
    std::operator<<(poVar1,"` as line feed is obsolete");
  }
  else {
    if (warning != W_SymbolAfterPlus) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                    ,0xa2,"void Refal2::CScanner::warning(TWarning, char)");
    }
    poVar1 = std::operator<<((ostream *)local_190,"unuseful symbol `");
    poVar1 = std::operator<<(poVar1,c);
    std::operator<<(poVar1,"` after plus");
  }
  line = this->line;
  position = this->position;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,1,c,&local_1c1);
  CError::SetTokenData((CError *)this,line,position,(string *)local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::ostringstream::str();
  CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Warning,local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  CError::ResetToken((CError *)this);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void CScanner::warning( TWarning warning, char c )
{
	std::ostringstream warningStream;
	switch( warning ) {
		case W_Semicolon:
			warningStream << "using `" << c << "` as line feed is obsolete";
			break;
		case W_SymbolAfterPlus:
			warningStream << "unuseful symbol `" << c << "` after plus";
			break;
		default:
			assert( false );
			break;
	}
	CError::SetTokenData( line, position, std::string( 1, c ) );
	CErrorsHelper::RaiseError( ES_Warning, warningStream.str() );
	CError::ResetToken();
}